

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O0

int BN_mask_bits(BIGNUM *a,int n)

{
  int iVar1;
  int w;
  int b;
  int local_4;
  
  if (n < 0) {
    local_4 = 0;
  }
  else {
    iVar1 = n / 0x40;
    if (iVar1 < a->top) {
      if (n % 0x40 == 0) {
        a->top = iVar1;
      }
      else {
        a->top = iVar1 + 1;
        a->d[iVar1] = (-1L << ((byte)(n % 0x40) & 0x3f) ^ 0xffffffffffffffffU) & a->d[iVar1];
      }
      bn_correct_top((BIGNUM *)a);
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int BN_mask_bits(BIGNUM *a, int n)
{
    int b, w;

    bn_check_top(a);
    if (n < 0)
        return 0;

    w = n / BN_BITS2;
    b = n % BN_BITS2;
    if (w >= a->top)
        return 0;
    if (b == 0)
        a->top = w;
    else {
        a->top = w + 1;
        a->d[w] &= ~(BN_MASK2 << b);
    }
    bn_correct_top(a);
    return (1);
}